

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP4Writer.cpp
# Opt level: O0

void __thiscall adios2::core::engine::BP4Writer::UpdateActiveFlag(BP4Writer *this,bool active)

{
  size_type sVar1;
  long in_RDI;
  void *unaff_retaddr;
  string *in_stack_00000008;
  FileDrainer *in_stack_00000010;
  string *in_stack_00000018;
  FileDrainer *in_stack_00000020;
  size_t i;
  char activeChar;
  int in_stack_00000054;
  undefined4 in_stack_00000058;
  int in_stack_0000005c;
  TransportMan *in_stack_00000060;
  char *in_stack_00000068;
  TransportMan *in_stack_00000070;
  ulong local_18;
  
  transportman::TransportMan::WriteFileAt
            (in_stack_00000070,in_stack_00000068,(size_t)in_stack_00000060,
             CONCAT44(in_stack_0000005c,in_stack_00000058),in_stack_00000054);
  transportman::TransportMan::FlushFiles(in_stack_00000060,in_stack_0000005c);
  transportman::TransportMan::SeekToFileEnd(in_stack_00000060,in_stack_0000005c);
  if ((*(byte *)(in_RDI + 0x749) & 1) != 0) {
    for (local_18 = 0;
        sVar1 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)(in_RDI + 0x8f8)), local_18 < sVar1; local_18 = local_18 + 1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(in_RDI + 0x910),local_18);
      burstbuffer::FileDrainer::AddOperationWriteAt
                (in_stack_00000020,in_stack_00000018,(size_t)in_stack_00000010,
                 (size_t)in_stack_00000008,unaff_retaddr);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(in_RDI + 0x910),local_18);
      burstbuffer::FileDrainer::AddOperationSeekEnd(in_stack_00000010,in_stack_00000008);
    }
  }
  return;
}

Assistant:

void BP4Writer::UpdateActiveFlag(const bool active)
{
    const char activeChar = (active ? '\1' : '\0');
    m_FileMetadataIndexManager.WriteFileAt(&activeChar, 1, m_BP4Serializer.m_ActiveFlagPosition);
    m_FileMetadataIndexManager.FlushFiles();
    m_FileMetadataIndexManager.SeekToFileEnd();
    if (m_DrainBB)
    {
        for (size_t i = 0; i < m_MetadataIndexFileNames.size(); ++i)
        {
            m_FileDrainer.AddOperationWriteAt(m_DrainMetadataIndexFileNames[i],
                                              m_BP4Serializer.m_ActiveFlagPosition, 1, &activeChar);
            m_FileDrainer.AddOperationSeekEnd(m_DrainMetadataIndexFileNames[i]);
        }
    }
}